

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<int,_std::greater<void>_>::fill_counters
          (k_ary_search_set<int,_std::greater<void>_> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  ulong __new_size;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar19;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar20;
  
  uVar10 = branch->height - 1;
  __new_size = this->m_arity;
  uVar5 = branch->height - 2;
  if (uVar5 == 0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 1;
    uVar11 = __new_size;
    do {
      uVar12 = uVar11;
      if ((uVar5 & 1) == 0) {
        uVar12 = 1;
      }
      lVar14 = lVar14 * uVar12;
      uVar11 = uVar11 * uVar11;
      bVar3 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar3);
    lVar14 = lVar14 + -1;
    if (uVar10 == 0) {
      sVar7 = branch->size;
      lVar13 = 0;
      lVar6 = 0;
      goto LAB_001ad5cf;
    }
  }
  lVar13 = 1;
  uVar5 = __new_size;
  uVar11 = uVar10;
  do {
    uVar12 = uVar5;
    if ((uVar11 & 1) == 0) {
      uVar12 = 1;
    }
    lVar13 = lVar13 * uVar12;
    uVar5 = uVar5 * uVar5;
    bVar3 = 1 < uVar11;
    uVar11 = uVar11 >> 1;
  } while (bVar3);
  sVar7 = branch->size;
  lVar6 = 1;
  uVar5 = __new_size;
  do {
    uVar11 = uVar5;
    if ((uVar10 & 1) == 0) {
      uVar11 = 1;
    }
    lVar6 = lVar6 * uVar11;
    uVar5 = uVar5 * uVar5;
    bVar3 = 1 < uVar10;
    uVar10 = uVar10 >> 1;
  } while (bVar3);
  lVar13 = lVar13 + -1;
  lVar6 = 1 - lVar6;
LAB_001ad5cf:
  if (sVar7 + 1 < __new_size) {
    __new_size = sVar7 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(counters,__new_size);
  auVar4 = _DAT_002e93a0;
  puVar1 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)puVar2 - (long)puVar1;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 3;
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    lVar9 = lVar8 + -1;
    auVar15._8_4_ = (int)lVar9;
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar15 = auVar15 ^ _DAT_002e93a0;
    auVar16 = _DAT_002e9390;
    do {
      auVar17 = auVar16 ^ auVar4;
      lVar20 = auVar16._8_8_;
      lVar9 = auVar16._0_8_ + 1;
      lVar19 = lVar20 + 1;
      auVar21._8_8_ = lVar19 * lVar14 + lVar6 + sVar7;
      auVar21._0_8_ = lVar9 * lVar14 + lVar6 + sVar7;
      auVar22._8_8_ = lVar19 * lVar13;
      auVar22._0_8_ = lVar9 * lVar13;
      auVar18 = auVar22 ^ auVar4;
      auVar23 = auVar21 ^ auVar4;
      iVar25 = -(uint)(auVar18._0_4_ < auVar23._0_4_);
      iVar26 = -(uint)(auVar18._4_4_ < auVar23._4_4_);
      iVar27 = -(uint)(auVar18._8_4_ < auVar23._8_4_);
      iVar28 = -(uint)(auVar18._12_4_ < auVar23._12_4_);
      auVar24._4_4_ = -(uint)(auVar23._4_4_ == auVar18._4_4_);
      auVar24._12_4_ = -(uint)(auVar23._12_4_ == auVar18._12_4_);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar18._4_4_ = iVar25;
      auVar18._0_4_ = iVar25;
      auVar18._8_4_ = iVar27;
      auVar18._12_4_ = iVar27;
      auVar23._4_4_ = iVar26;
      auVar23._0_4_ = iVar26;
      auVar23._8_4_ = iVar28;
      auVar23._12_4_ = iVar28;
      auVar23 = auVar23 | auVar24 & auVar18;
      auVar18 = ~auVar23 & auVar21 | auVar22 & auVar23;
      if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                  auVar15._4_4_ < auVar17._4_4_) & 1)) {
        puVar1[uVar10] = auVar18._0_8_ + uVar10;
      }
      if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
          auVar17._12_4_ <= auVar15._12_4_) {
        puVar1[uVar10 + 1] = auVar18._8_8_ + uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar20 + 2;
    } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar10);
  }
  if (puVar2[-1] == branch->size) {
    return;
  }
  __assert_fail("counters.back() == branch.size",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x197,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_counters(const k_ary_search_set_branch &, std::vector<std::size_t> &) [Value = int, Compare = std::greater<void>]"
               );
}

Assistant:

void
            fill_counters
            (
                const k_ary_search_set_branch & branch,
                std::vector<std::size_t> & counters
            )
        {
            const std::size_t max_subtree_height = branch.height - 1;
            const std::size_t min_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height - 1);
            const std::size_t max_subtree_elements =
                perfect_tree_size(m_arity, max_subtree_height);
            const std::size_t elements_in_last_row =
                branch.size - perfect_tree_size(m_arity, branch.height - 1);

            counters.resize(std::min(m_arity, branch.size + 1));
            for (std::size_t i = 0; i < counters.size(); ++i)
            {
                counters[i] = i + std::min
                (
                    (i + 1) * min_subtree_elements + elements_in_last_row,
                    (i + 1) * max_subtree_elements
                );
            }
            BOOST_ASSERT(counters.back() == branch.size);
        }